

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

NodeAndBucket __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
FindHelper(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,ViewType k)

{
  NodeBase **ppNVar1;
  NodeBase *__n;
  int iVar2;
  uint64_t uVar3;
  uintptr_t v_1;
  uchar *bytes;
  NodeBase *pNVar4;
  NodeBase *pNVar5;
  uint64_t v;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  NodeAndBucket NVar9;
  
  pNVar4 = (NodeBase *)k._M_len;
  AssertLoadFactor(this);
  uVar3 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                    (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,k._M_str,pNVar4);
  uVar7 = (uVar3 ^ (ulong)pNVar4) * -0x234dd359734ecb13;
  ppNVar1 = (this->super_UntypedMapBase).table_;
  uVar7 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
            (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
            (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ (ulong)ppNVar1) * -0x234dd359734ecb13;
  lVar8 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
            (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
            (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ (ulong)ppNVar1) * -0x234dd359734ecb13;
  uVar6 = ((uint)(byte)((ulong)lVar8 >> 0x38) | ((uint)((ulong)lVar8 >> 0x20) & 0xff0000) >> 8 |
           (uint)((ulong)lVar8 >> 0x18) & 0xff0000 | (uint)((ulong)lVar8 >> 8) & 0xff000000) &
          (this->super_UntypedMapBase).num_buckets_ - 1;
  for (pNVar5 = ppNVar1[uVar6]; pNVar5 != (NodeBase *)0x0; pNVar5 = pNVar5->next) {
    __n = pNVar5[2].next;
    if (__n == pNVar4) {
      if (__n == (NodeBase *)0x0) break;
      iVar2 = bcmp(pNVar5[1].next,k._M_str,(size_t)__n);
      if (iVar2 == 0) break;
    }
  }
  NVar9.bucket = uVar6;
  NVar9.node = pNVar5;
  NVar9._12_4_ = 0;
  return NVar9;
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k) const {
    AssertLoadFactor();
    map_index_t b = BucketNumber(k);
    for (auto* node = table_[b]; node != nullptr; node = node->next) {
      if (TS::ToView(static_cast<KeyNode*>(node)->key()) == k) {
        return {node, b};
      }
    }
    return {nullptr, b};
  }